

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O3

TCompareResult __thiscall
Refal2::CArbitraryInteger::compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  TCompareResult TVar7;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __tmp;
  uint *puVar8;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  
  puVar5 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar10 = (long)puVar8 - (long)puVar5 >> 2;
  puVar6 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar9 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = (long)puVar9 - (long)puVar6 >> 2;
  TVar7 = CR_Less;
  if ((uVar11 <= uVar10) && (TVar7 = CR_Great, uVar10 <= uVar11)) {
    do {
      if (puVar8 == puVar5) {
        if (puVar9 == puVar6) {
          return CR_Equal;
        }
        __assert_fail("j == operand.crend()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                      ,0x111,
                      "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                     );
      }
      puVar1 = puVar8 + -1;
      puVar8 = puVar8 + -1;
      puVar2 = puVar9 + -1;
      puVar3 = puVar9 + -1;
      puVar9 = puVar2;
    } while (*puVar1 == *puVar3);
    uVar4 = *puVar2;
    if (*puVar8 == uVar4) {
      __assert_fail("*i != *j",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/ArbitraryInteger.cpp"
                    ,0x114,
                    "CArbitraryInteger::TCompareResult Refal2::CArbitraryInteger::compare(const CArbitraryInteger &) const"
                   );
    }
    TVar7 = -(uint)(*puVar8 < uVar4) | CR_Great;
  }
  return TVar7;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::compare(
	const CArbitraryInteger& operand ) const
{
	if( size() < operand.size() ) {
		return CR_Less;
	} else if( operand.size() < size() ) {
		return CR_Great;
	} else {
		assert( operand.size() == size() );
		const_reverse_iterator i = crbegin();
		const_reverse_iterator j = operand.crbegin();
		while( i != crend() && *i == *j ) {
			++i;
			++j;
		}
		if( i == crend() ) {
			assert( j == operand.crend() );
			return CR_Equal;
		}
		assert( *i != *j );
		return ( *i < *j ? CR_Less : CR_Great );
	}
}